

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

BasicBlock * __thiscall
spvtools::opt::Loop::FindLoopPreheader(Loop *this,DominatorAnalysis *dom_analysis)

{
  bool bVar1;
  uint32_t blk_id;
  CFG *this_00;
  DominatorTreeNode *a;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  DominatorTreeNode *b;
  pointer puVar2;
  BasicBlock *pBVar3;
  BasicBlock *this_01;
  bool is_preheader;
  Loop *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> header_pred;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = IRContext::cfg(this->context_);
  a = DominatorTree::GetTreeNode((DominatorTree *)dom_analysis,this->loop_header_);
  local_70 = this;
  blk_id = BasicBlock::id(this->loop_header_);
  __x = CFG::preds(this_00,blk_id);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&header_pred,__x);
  puVar2 = header_pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_01 = (BasicBlock *)0x0;
  do {
    if (puVar2 == header_pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      if (this_01 == (BasicBlock *)0x0) {
        __assert_fail("loop_pred && \"The header node is the entry block ?\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp"
                      ,0xf3,
                      "BasicBlock *spvtools::opt::Loop::FindLoopPreheader(DominatorAnalysis *)");
      }
      is_preheader = true;
      local_50._8_4_ = BasicBlock::id(local_70->loop_header_);
      local_50._12_4_ = 0;
      local_38 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:252:7)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_descriptor.cpp:252:7)>
                 ::_M_manager;
      local_50._M_unused._M_object = &is_preheader;
      BasicBlock::ForEachSuccessorLabel(this_01,(function<void_(unsigned_int)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      pBVar3 = (BasicBlock *)0x0;
      if (is_preheader != false) {
        pBVar3 = this_01;
      }
LAB_0020df2f:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&header_pred.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return pBVar3;
    }
    b = DominatorTree::GetTreeNode((DominatorTree *)dom_analysis,*puVar2);
    pBVar3 = this_01;
    if (((b != (DominatorTreeNode *)0x0) &&
        (bVar1 = DominatorTree::Dominates((DominatorTree *)dom_analysis,a,b), !bVar1)) &&
       (pBVar3 = b->bb_, pBVar3 != this_01 && this_01 != (BasicBlock *)0x0)) {
      pBVar3 = (BasicBlock *)0x0;
      goto LAB_0020df2f;
    }
    puVar2 = puVar2 + 1;
    this_01 = pBVar3;
  } while( true );
}

Assistant:

BasicBlock* Loop::FindLoopPreheader(DominatorAnalysis* dom_analysis) {
  CFG* cfg = context_->cfg();
  DominatorTree& dom_tree = dom_analysis->GetDomTree();
  DominatorTreeNode* header_node = dom_tree.GetTreeNode(loop_header_);

  // The loop predecessor.
  BasicBlock* loop_pred = nullptr;

  auto header_pred = cfg->preds(loop_header_->id());
  for (uint32_t p_id : header_pred) {
    DominatorTreeNode* node = dom_tree.GetTreeNode(p_id);
    if (node && !dom_tree.Dominates(header_node, node)) {
      // The predecessor is not part of the loop, so potential loop preheader.
      if (loop_pred && node->bb_ != loop_pred) {
        // If we saw 2 distinct predecessors that are outside the loop, we don't
        // have a loop preheader.
        return nullptr;
      }
      loop_pred = node->bb_;
    }
  }
  // Safe guard against invalid code, SPIR-V spec forbids loop with the entry
  // node as header.
  assert(loop_pred && "The header node is the entry block ?");

  // So we have a unique basic block that can enter this loop.
  // If this loop is the unique successor of this block, then it is a loop
  // preheader.
  bool is_preheader = true;
  uint32_t loop_header_id = loop_header_->id();
  const auto* const_loop_pred = loop_pred;
  const_loop_pred->ForEachSuccessorLabel(
      [&is_preheader, loop_header_id](const uint32_t id) {
        if (id != loop_header_id) is_preheader = false;
      });
  if (is_preheader) return loop_pred;
  return nullptr;
}